

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

uint * Kit_DsdTruthComputeNode_rec(Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,int Id)

{
  ushort uVar1;
  int iVar2;
  Kit_DsdObj_t KVar3;
  uint uVar4;
  Kit_DsdObj_t *pKVar5;
  uint *pOut;
  uint *puVar6;
  uint uVar7;
  ulong uVar8;
  undefined8 in_R9;
  uint *local_b8 [17];
  
  pKVar5 = Kit_DsdNtkObj(pNtk,Id);
  pOut = (uint *)Vec_PtrEntry(p->vTtNodes,Id);
  if (pKVar5 == (Kit_DsdObj_t *)0x0) {
    if (Id < (int)(uint)pNtk->nVars) {
      return pOut;
    }
    __assert_fail("Id < pNtk->nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0x23f,
                  "unsigned int *Kit_DsdTruthComputeNode_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int)");
  }
  KVar3 = *pKVar5;
  uVar7 = (uint)KVar3 >> 6 & 7;
  if (uVar7 == 1) {
    if ((uint)KVar3 < 0x4000000) {
      Kit_TruthFill(pOut,(uint)pNtk->nVars);
      return pOut;
    }
    __assert_fail("pObj->nFans == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0x246,
                  "unsigned int *Kit_DsdTruthComputeNode_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int)");
  }
  if (uVar7 == 2) {
    if (((uint)KVar3 & 0xfc000000) != 0x4000000) {
      __assert_fail("pObj->nFans == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                    ,0x24e,
                    "unsigned int *Kit_DsdTruthComputeNode_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int)"
                   );
    }
    uVar1 = *(ushort *)(pKVar5 + 1);
    iVar2 = Abc_Lit2Var((uint)uVar1);
    puVar6 = Kit_DsdTruthComputeNode_rec(p,pNtk,iVar2);
    iVar2 = Abc_LitIsCompl((uint)uVar1);
    uVar7 = (uint)pNtk->nVars;
    if (iVar2 != 0) {
LAB_0047d0e6:
      Kit_TruthNot(pOut,puVar6,uVar7);
      return pOut;
    }
  }
  else {
    for (uVar8 = 0; uVar8 < (uint)KVar3 >> 0x1a; uVar8 = uVar8 + 1) {
      iVar2 = Abc_Lit2Var((uint)*(ushort *)(&pKVar5[1].field_0x0 + uVar8 * 2));
      puVar6 = Kit_DsdTruthComputeNode_rec(p,pNtk,iVar2);
      local_b8[uVar8] = puVar6;
      KVar3 = *pKVar5;
    }
    uVar7 = (uint)KVar3 >> 6 & 7;
    if (uVar7 == 3) {
      Kit_TruthFill(pOut,(uint)pNtk->nVars);
      for (uVar8 = 0; uVar8 < (uint)*pKVar5 >> 0x1a; uVar8 = uVar8 + 1) {
        puVar6 = local_b8[uVar8];
        uVar1 = pNtk->nVars;
        iVar2 = Abc_LitIsCompl((uint)*(ushort *)(&pKVar5[1].field_0x0 + uVar8 * 2));
        Kit_TruthAndPhase(pOut,pOut,puVar6,(uint)uVar1,iVar2,(int)in_R9);
      }
      return pOut;
    }
    if (uVar7 == 4) {
      Kit_TruthClear(pOut,(uint)pNtk->nVars);
      uVar7 = 0;
      for (uVar8 = 0; uVar8 < (uint)*pKVar5 >> 0x1a; uVar8 = uVar8 + 1) {
        uVar1 = *(ushort *)(&pKVar5[1].field_0x0 + uVar8 * 2);
        Kit_TruthXor(pOut,pOut,local_b8[uVar8],(uint)pNtk->nVars);
        uVar4 = Abc_LitIsCompl((uint)uVar1);
        uVar7 = uVar7 ^ uVar4;
      }
      if (uVar7 == 0) {
        return pOut;
      }
      uVar7 = (uint)pNtk->nVars;
      puVar6 = pOut;
      goto LAB_0047d0e6;
    }
    if (uVar7 != 5) {
      __assert_fail("pObj->Type == KIT_DSD_PRIME",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                    ,0x272,
                    "unsigned int *Kit_DsdTruthComputeNode_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int)"
                   );
    }
    for (uVar8 = 0; uVar8 < (uint)KVar3 >> 0x1a; uVar8 = uVar8 + 1) {
      iVar2 = Abc_LitIsCompl((uint)*(ushort *)(&pKVar5[1].field_0x0 + uVar8 * 2));
      if (iVar2 != 0) {
        Kit_TruthNot(local_b8[uVar8],local_b8[uVar8],(uint)pNtk->nVars);
      }
      KVar3 = *pKVar5;
    }
    puVar6 = (uint *)0x0;
    if (((uint)KVar3 & 0x1c0) == 0x140) {
      puVar6 = (uint *)(&pKVar5[1].field_0x0 + ((uint)KVar3 >> 8 & 0x3fc));
    }
    puVar6 = Kit_TruthCompose(p->dd,puVar6,(uint)KVar3 >> 0x1a,local_b8,(uint)pNtk->nVars,p->vTtBdds
                              ,p->vNodes);
    uVar7 = (uint)pNtk->nVars;
  }
  Kit_TruthCopy(pOut,puVar6,uVar7);
  return pOut;
}

Assistant:

unsigned * Kit_DsdTruthComputeNode_rec( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, int Id )
{
    Kit_DsdObj_t * pObj;
    unsigned * pTruthRes, * pTruthFans[16], * pTruthTemp;
    unsigned i, iLit, fCompl;
//    unsigned m, nMints, * pTruthPrime, * pTruthMint; 

    // get the node with this ID
    pObj = Kit_DsdNtkObj( pNtk, Id );
    pTruthRes = (unsigned *)Vec_PtrEntry( p->vTtNodes, Id );

    // special case: literal of an internal node
    if ( pObj == NULL )
    {
        assert( Id < pNtk->nVars );
        return pTruthRes;
    }

    // constant node
    if ( pObj->Type == KIT_DSD_CONST1 )
    {
        assert( pObj->nFans == 0 );
        Kit_TruthFill( pTruthRes, pNtk->nVars );
        return pTruthRes;
    }

    // elementary variable node
    if ( pObj->Type == KIT_DSD_VAR )
    {
        assert( pObj->nFans == 1 );
        iLit = pObj->pFans[0];
        pTruthFans[0] = Kit_DsdTruthComputeNode_rec( p, pNtk, Abc_Lit2Var(iLit) );
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthRes, pTruthFans[0], pNtk->nVars );
        else
            Kit_TruthCopy( pTruthRes, pTruthFans[0], pNtk->nVars );
        return pTruthRes;
    }

    // collect the truth tables of the fanins
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        pTruthFans[i] = Kit_DsdTruthComputeNode_rec( p, pNtk, Abc_Lit2Var(iLit) );
    // create the truth table

    // simple gates
    if ( pObj->Type == KIT_DSD_AND )
    {
        Kit_TruthFill( pTruthRes, pNtk->nVars );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            Kit_TruthAndPhase( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars, 0, Abc_LitIsCompl(iLit) );
        return pTruthRes;
    }
    if ( pObj->Type == KIT_DSD_XOR )
    {
        Kit_TruthClear( pTruthRes, pNtk->nVars );
        fCompl = 0;
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        {
            Kit_TruthXor( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars );
            fCompl ^= Abc_LitIsCompl(iLit);
        }
        if ( fCompl )
            Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
        return pTruthRes;
    }
    assert( pObj->Type == KIT_DSD_PRIME );
/*
    // get the truth table of the prime node
    pTruthPrime = Kit_DsdObjTruth( pObj );
    // get storage for the temporary minterm
    pTruthMint = Vec_PtrEntry(p->vTtNodes, pNtk->nVars + pNtk->nNodes);
    // go through the minterms
    nMints = (1 << pObj->nFans);
    Kit_TruthClear( pTruthRes, pNtk->nVars );
    for ( m = 0; m < nMints; m++ )
    {
        if ( !Kit_TruthHasBit(pTruthPrime, m) )
            continue;
        Kit_TruthFill( pTruthMint, pNtk->nVars );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            Kit_TruthAndPhase( pTruthMint, pTruthMint, pTruthFans[i], pNtk->nVars, 0, ((m & (1<<i)) == 0) ^ Abc_LitIsCompl(iLit) );
        Kit_TruthOr( pTruthRes, pTruthRes, pTruthMint, pNtk->nVars );
    }
*/
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthFans[i], pTruthFans[i], pNtk->nVars );
    pTruthTemp = Kit_TruthCompose( p->dd, Kit_DsdObjTruth(pObj), pObj->nFans, pTruthFans, pNtk->nVars, p->vTtBdds, p->vNodes );
    Kit_TruthCopy( pTruthRes, pTruthTemp, pNtk->nVars );
    return pTruthRes;
}